

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall BanSearchIRCCommand::create(BanSearchIRCCommand *this)

{
  Jupiter::Command::addTrigger(this,9,"bansearch");
  Jupiter::Command::addTrigger(this,7,"bsearch");
  Jupiter::Command::addTrigger(this,7,"banfind");
  Jupiter::Command::addTrigger(this,5,"bfind");
  Jupiter::Command::addTrigger(this,7,"banlogs");
  Jupiter::Command::addTrigger(this,5,"blogs");
  IRCCommand::setAccessLevel((int)this);
  return;
}

Assistant:

void BanSearchIRCCommand::create() {
	this->addTrigger("bansearch"sv);
	this->addTrigger("bsearch"sv);
	this->addTrigger("banfind"sv);
	this->addTrigger("bfind"sv);
	this->addTrigger("banlogs"sv);
	this->addTrigger("blogs"sv);
	this->setAccessLevel(2);
}